

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddField<std::__cxx11::string>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  int *piVar2;
  Arena *this_01;
  uint32 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  
  uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (RepeatedPtrFieldBase *)
            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  piVar2 = *(int **)((long)&message[2].super_MessageLite._vptr_MessageLite + (ulong)uVar3);
  if (piVar2 != (int *)0x0) {
    iVar1 = this_00->current_size_;
    if (iVar1 < *piVar2) {
      this_00->current_size_ = iVar1 + 1;
      return *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (piVar2 + (long)iVar1 * 2 + 2);
    }
    if (*piVar2 != this_00->total_size_) goto LAB_005c90f6;
  }
  RepeatedPtrFieldBase::Reserve(this_00,this_00->total_size_ + 1);
LAB_005c90f6:
  this_00->rep_->allocated_size = this_00->rep_->allocated_size + 1;
  this_01 = this_00->arena_;
  if (this_01 == (Arena *)0x0) {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
  }
  else {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Arena::AllocateAligned(this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
    Arena::AddListNode(this_01,elem,arena_destruct_object<std::__cxx11::string>);
  }
  iVar1 = this_00->current_size_;
  this_00->current_size_ = iVar1 + 1;
  this_00->rep_->elements[iVar1] = elem;
  return elem;
}

Assistant:

inline Type* GeneratedMessageReflection::AddField(
    Message* message, const FieldDescriptor* field) const {
  RepeatedPtrField<Type>* repeated =
    MutableRaw<RepeatedPtrField<Type> >(message, field);
  return repeated->Add();
}